

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenval.c
# Opt level: O0

void SearchEigenval(size_t n,double *Alpha,double *Beta,size_t k,double BoundMin,double BoundMax,
                   Boolean *Found,double *Lambda)

{
  size_t sVar1;
  double *Lambda_local;
  Boolean *Found_local;
  double BoundMax_local;
  double BoundMin_local;
  size_t k_local;
  double *Beta_local;
  double *Alpha_local;
  size_t n_local;
  
  sVar1 = NoSmallerEigenvals(n,Alpha,Beta,BoundMin);
  if ((sVar1 < k) &&
     (sVar1 = NoSmallerEigenvals(n,Alpha,Beta,BoundMax), Found_local = (Boolean *)BoundMax,
     BoundMax_local = BoundMin, k <= sVar1)) {
    while (EigenvalEps * 0.01 * (ABS(BoundMax_local) + ABS((double)Found_local)) <
           ABS((double)Found_local - BoundMax_local)) {
      *Lambda = (BoundMax_local + (double)Found_local) * 0.5;
      sVar1 = NoSmallerEigenvals(n,Alpha,Beta,*Lambda);
      if (sVar1 < k) {
        BoundMax_local = *Lambda;
      }
      else {
        Found_local = (Boolean *)*Lambda;
      }
    }
    *Lambda = (double)Found_local;
    *Found = True;
  }
  else {
    *Found = False;
  }
  return;
}

Assistant:

static void SearchEigenval(size_t n, double *Alpha, double *Beta, size_t k,
         double BoundMin, double BoundMax, Boolean *Found, double *Lambda)
/* search the k-th eigenvalue of the tridiagonal matrix
   (Beta[i-1] Alpha[i] Beta[i]) (where 1 <= i <= n) 
   by means of the method of bisection */
{
    /*
     *  for details to the method of bisection see
     *
     *  G. H. Golub, Ch. F. van Loan:
     *  Matrix Computations;
     *  North Oxford Academic, Oxford, 1986
     *
     */
   
    if (NoSmallerEigenvals(n, Alpha, Beta, BoundMin) < k
	&& NoSmallerEigenvals(n, Alpha, Beta, BoundMax) >= k) {
        while (fabs(BoundMax - BoundMin) > 0.01 * EigenvalEps 
	    * (fabs(BoundMin) + fabs(BoundMax))) {
            *Lambda = 0.5 * (BoundMin + BoundMax);
	    if (NoSmallerEigenvals(n, Alpha, Beta, *Lambda) >= k) 
	        BoundMax = *Lambda;
   	    else
	        BoundMin = *Lambda;
        }
	*Lambda = BoundMax;

	*Found = True;
    } else {
	*Found = False;
    }
}